

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall
mp::SolverOptionSynonym::SolverOptionSynonym
          (SolverOptionSynonym *this,char *names,SolverOption *real)

{
  char *pcVar1;
  char *__s;
  char **args;
  pointer local_58;
  string local_50;
  
  args = (char **)0x0;
  SolverOption::SolverOption(&this->super_SolverOption,names,"",(ValueArrayRef)ZEXT816(0),false);
  (this->super_SolverOption)._vptr_SolverOption = (_func_int **)&PTR__SolverOptionSynonym_002924a0;
  this->real_ = real;
  (this->desc_)._M_dataplus._M_p = (pointer)&(this->desc_).field_2;
  (this->desc_)._M_string_length = 0;
  (this->desc_).field_2._M_local_buf[0] = '\0';
  local_58 = (real->name_)._M_dataplus._M_p;
  fmt::sprintf<char_const*>(&local_50,(fmt *)"Synonym for %s.",(CStringRef)&local_58,args);
  std::__cxx11::string::operator=((string *)&this->desc_,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (char *)(this->super_SolverOption).description_._M_string_length;
  __s = (this->desc_)._M_dataplus._M_p;
  strlen(__s);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_SolverOption).description_,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

SolverOptionSynonym(const char* names, SolverOption& real) :
    SolverOption(names, ""), real_(&real) {
    desc_ = fmt::sprintf("Synonym for %s.", real_->name());
    set_description( desc_.c_str() );
  }